

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

parasail_matrix_t *
parasail_matrix_pssm_create_internal(char *alphabet,int *values,int length,int case_sensitive)

{
  int *piVar1;
  byte bVar2;
  __int32_t *p_Var3;
  __int32_t *p_Var4;
  size_t __n;
  int *piVar5;
  int *piVar6;
  __int32_t **pp_Var7;
  char *__dest;
  parasail_matrix_t *ppVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  size_t sVar13;
  int iVar14;
  
  if (alphabet == (char *)0x0) {
    parasail_matrix_pssm_create_internal_cold_6();
  }
  else if (values == (int *)0x0) {
    parasail_matrix_pssm_create_internal_cold_5();
  }
  else if (length < 1) {
    parasail_matrix_pssm_create_internal_cold_4();
  }
  else {
    __n = strlen(alphabet);
    if (__n < 0x7fffffff) {
      uVar11 = (ulong)(uint)length;
      sVar13 = uVar11 * (__n + 1) * 4;
      piVar5 = (int *)malloc(sVar13);
      if (piVar5 == (int *)0x0) {
LAB_004b4811:
        fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_matrix_pssm_create_internal",
                sVar13);
        return (parasail_matrix_t *)0x0;
      }
      if (__n == 0) {
        iVar10 = -0x80000000;
        iVar12 = 0x7fffffff;
      }
      else {
        iVar12 = 0x7fffffff;
        iVar10 = -0x80000000;
        lVar9 = 0;
        do {
          iVar14 = values[lVar9];
          if (iVar14 < iVar12) {
            iVar12 = iVar14;
          }
          if (iVar10 < iVar14) {
            iVar10 = iVar14;
          }
          lVar9 = lVar9 + 1;
        } while (__n * uVar11 - lVar9 != 0);
      }
      piVar6 = piVar5;
      do {
        if (__n != 0) {
          memcpy(piVar6,values,__n * 4);
        }
        piVar6[__n] = iVar12;
        values = values + __n;
        piVar6 = piVar6 + __n + 1;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
      piVar6 = (int *)malloc(0x400);
      if (piVar6 == (int *)0x0) {
        parasail_matrix_pssm_create_internal_cold_2();
      }
      else {
        iVar14 = (int)__n;
        lVar9 = 0;
        do {
          piVar1 = piVar6 + lVar9;
          *piVar1 = iVar14;
          piVar1[1] = iVar14;
          piVar1[2] = iVar14;
          piVar1[3] = iVar14;
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0x100);
        if (case_sensitive == 0) {
          if (__n != 0) {
            pp_Var7 = __ctype_toupper_loc();
            p_Var3 = *pp_Var7;
            pp_Var7 = __ctype_tolower_loc();
            p_Var4 = *pp_Var7;
            sVar13 = 0;
            do {
              bVar2 = alphabet[sVar13];
              piVar6[p_Var3[bVar2]] = (int)sVar13;
              piVar6[p_Var4[bVar2]] = (int)sVar13;
              sVar13 = sVar13 + 1;
            } while (__n != sVar13);
          }
        }
        else if (__n != 0) {
          sVar13 = 0;
          do {
            piVar6[(byte)alphabet[sVar13]] = (int)sVar13;
            sVar13 = sVar13 + 1;
          } while (__n != sVar13);
        }
        sVar13 = __n + 2;
        __dest = (char *)malloc(sVar13);
        if (__dest == (char *)0x0) goto LAB_004b4811;
        memcpy(__dest,alphabet,__n);
        (__dest + __n)[0] = '*';
        (__dest + __n)[1] = '\0';
        ppVar8 = (parasail_matrix_t *)malloc(0x48);
        if (ppVar8 != (parasail_matrix_t *)0x0) {
          ppVar8->name = "";
          ppVar8->matrix = piVar5;
          ppVar8->mapper = piVar6;
          ppVar8->size = (int)(__n + 1);
          ppVar8->max = iVar10;
          ppVar8->min = iVar12;
          ppVar8->user_matrix = piVar5;
          ppVar8->type = 1;
          ppVar8->length = length;
          ppVar8->alphabet = __dest;
          ppVar8->query = (char *)0x0;
          return ppVar8;
        }
        parasail_matrix_pssm_create_internal_cold_1();
      }
    }
    else {
      parasail_matrix_pssm_create_internal_cold_3();
    }
  }
  return (parasail_matrix_t *)0x0;
}

Assistant:

static parasail_matrix_t* parasail_matrix_pssm_create_internal(
        const char *alphabet, const int *values, const int length, int case_sensitive)
{
    parasail_matrix_t *retval = NULL;
    int *matrix = NULL;
    int *mapper = NULL;
    char *alphabet_copy = NULL;
    size_t size = 0;
    size_t size1 = 0;
    size_t i = 0;
    size_t j = 0;
    size_t c = 0;
    size_t v = 0;
    int min = INT_MAX;
    int max = INT_MIN;

    PARASAIL_CHECK_NULL(alphabet);
    PARASAIL_CHECK_NULL(values);
    if (length <= 0) {
        fprintf(stderr, "%s: length must be > 0\n", __func__);
        return NULL;
    }

    size = strlen(alphabet);
    if (size >= INT_MAX) {
        fprintf(stderr, "%s: alphabet is too large\n", __func__);
        return NULL;
    }
    size1 = size + 1;

    PARASAIL_CALLOC(matrix, int, size1*length);

    /* find min and max values */
    for (i=0; i<size*length; ++i) {
        min = values[i] < min ? values[i] : min;
        max = values[i] > max ? values[i] : max;
    }

    for (i=0; i<(size_t)length; ++i) {
        for (j=0; j<size; ++j) {
            matrix[c++] = values[v++];
        }
        matrix[c++] = min;
    }

    PARASAIL_CALLOC(mapper, int, 256);
    parasail_memset_int(mapper, (int)size, 256);
    if (case_sensitive) {
        for (i=0; i<size; ++i) {
            mapper[(unsigned char)alphabet[i]] = (int)i;
        }
    }
    else {
        for (i=0; i<size; ++i) {
            mapper[toupper((unsigned char)alphabet[i])] = (int)i;
            mapper[tolower((unsigned char)alphabet[i])] = (int)i;
        }
    }

    PARASAIL_CALLOC(alphabet_copy, char, size1+1);
    (void)memcpy(alphabet_copy, alphabet, sizeof(char) * size);
    alphabet_copy[size] = '*';
    alphabet_copy[size1] = '\0';

    PARASAIL_NEW(retval, parasail_matrix_t);
    retval->name = "";
    retval->matrix = matrix;
    retval->mapper = mapper;
    retval->size = (int)size1;
    retval->max = max;
    retval->min = min;
    retval->user_matrix = matrix;
    retval->type = PARASAIL_MATRIX_TYPE_PSSM;
    retval->length = length;
    retval->alphabet = alphabet_copy;
    retval->query = NULL;
    return retval;
}